

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

ErrorData *
duckdb::DataTable::AppendToIndexes
          (ErrorData *__return_storage_ptr__,TableIndexList *indexes,
          optional_ptr<duckdb::TableIndexList,_true> delete_indexes,DataChunk *chunk,row_t row_start
          ,IndexAppendMode index_append_mode)

{
  pointer puVar1;
  pointer ppBVar2;
  bool bVar3;
  int iVar4;
  BoundIndex *this;
  optional_ptr<duckdb::BoundIndex,_true> oVar5;
  TableIndexList *this_00;
  InternalException *this_01;
  pointer this_02;
  pointer ppBVar6;
  optional_ptr<duckdb::TableIndexList,_true> delete_indexes_local;
  vector<duckdb::BoundIndex_*,_true> already_appended;
  IndexAppendInfo index_append_info;
  LogicalType local_130;
  Vector row_ids;
  BoundIndex *local_b0 [16];
  
  delete_indexes_local = delete_indexes;
  ErrorData::ErrorData(__return_storage_ptr__);
  bVar3 = TableIndexList::Empty(indexes);
  if (!bVar3) {
    LogicalType::LogicalType(&local_130,BIGINT);
    Vector::Vector(&row_ids,&local_130,0x800);
    LogicalType::~LogicalType(&local_130);
    VectorOperations::GenerateSequence(&row_ids,chunk->count,row_start,1);
    already_appended.super_vector<duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>_>.
    super__Vector_base<duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    already_appended.super_vector<duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>_>.
    super__Vector_base<duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    already_appended.super_vector<duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>_>.
    super__Vector_base<duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::mutex::lock(&indexes->indexes_lock);
    puVar1 = (indexes->indexes).
             super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_02 = (indexes->indexes).
                   super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar1;
        this_02 = this_02 + 1) {
      this = (BoundIndex *)
             unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*(this_02)
      ;
      iVar4 = (*(this->super_Index)._vptr_Index[2])(this);
      if ((char)iVar4 == '\0') {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_b0,"unbound index in DataTable::AppendToIndexes",
                   (allocator *)&index_append_info);
        InternalException::InternalException(this_01,(string *)local_b0);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar4 = (*(this->super_Index)._vptr_Index[5])(this);
      if ((byte)((char)iVar4 - 3U) < 0xfe) {
        oVar5.ptr = (BoundIndex *)0x0;
      }
      else {
        oVar5.ptr = (BoundIndex *)0x0;
        if (delete_indexes_local.ptr != (TableIndexList *)0x0) {
          this_00 = optional_ptr<duckdb::TableIndexList,_true>::operator->(&delete_indexes_local);
          oVar5 = TableIndexList::Find(this_00,&this->name);
        }
      }
      index_append_info.append_mode = index_append_mode;
      index_append_info.delete_index.ptr = oVar5.ptr;
      BoundIndex::Append((ErrorData *)local_b0,this,chunk,&row_ids,&index_append_info);
      ErrorData::operator=(__return_storage_ptr__,(ErrorData *)local_b0);
      ErrorData::~ErrorData((ErrorData *)local_b0);
      if (__return_storage_ptr__->initialized != false) {
        pthread_mutex_unlock((pthread_mutex_t *)indexes);
        ppBVar2 = already_appended.
                  super_vector<duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>_>.
                  super__Vector_base<duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppBVar6 = already_appended.
                       super_vector<duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>_>.
                       super__Vector_base<duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppBVar6 != ppBVar2;
            ppBVar6 = ppBVar6 + 1) {
          BoundIndex::Delete(*ppBVar6,chunk,&row_ids);
        }
        goto LAB_01ac9bda;
      }
      local_b0[0] = this;
      ::std::vector<duckdb::BoundIndex*,std::allocator<duckdb::BoundIndex*>>::
      emplace_back<duckdb::BoundIndex*>
                ((vector<duckdb::BoundIndex*,std::allocator<duckdb::BoundIndex*>> *)
                 &already_appended,local_b0);
    }
    pthread_mutex_unlock((pthread_mutex_t *)indexes);
LAB_01ac9bda:
    ::std::_Vector_base<duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>_>::~_Vector_base
              ((_Vector_base<duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>_> *)
               &already_appended);
    Vector::~Vector(&row_ids);
  }
  return __return_storage_ptr__;
}

Assistant:

ErrorData DataTable::AppendToIndexes(TableIndexList &indexes, optional_ptr<TableIndexList> delete_indexes,
                                     DataChunk &chunk, row_t row_start, const IndexAppendMode index_append_mode) {
	ErrorData error;
	if (indexes.Empty()) {
		return error;
	}

	// first generate the vector of row identifiers
	Vector row_ids(LogicalType::ROW_TYPE);
	VectorOperations::GenerateSequence(row_ids, chunk.size(), row_start, 1);

	vector<BoundIndex *> already_appended;
	bool append_failed = false;
	// now append the entries to the indices
	indexes.Scan([&](Index &index_to_append) {
		if (!index_to_append.IsBound()) {
			throw InternalException("unbound index in DataTable::AppendToIndexes");
		}
		auto &index = index_to_append.Cast<BoundIndex>();

		// Find the matching delete index.
		optional_ptr<BoundIndex> delete_index;
		if (index.IsUnique()) {
			if (delete_indexes) {
				delete_index = delete_indexes->Find(index.name);
			}
		}

		try {
			IndexAppendInfo index_append_info(index_append_mode, delete_index);
			error = index.Append(chunk, row_ids, index_append_info);
		} catch (std::exception &ex) {
			error = ErrorData(ex);
		}

		if (error.HasError()) {
			append_failed = true;
			return true;
		}
		already_appended.push_back(&index);
		return false;
	});

	if (append_failed) {
		// constraint violation!
		// remove any appended entries from previous indexes (if any)
		for (auto *index : already_appended) {
			index->Delete(chunk, row_ids);
		}
	}
	return error;
}